

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::GetRawActiveDataset
          (CommissionerImpl *this,Handler<ByteArray> *aHandler,uint16_t aDatasetFlags)

{
  type tVar1;
  char *pcVar2;
  int iVar3;
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  *this_00;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar7;
  bool bVar8;
  format_args args;
  format_args args_00;
  Error error;
  ByteArray datasetList;
  anon_class_32_1_d0c21527 onResponse;
  writer write;
  Request request;
  undefined1 local_1e8 [8];
  pointer local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  type local_1c0;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  size_t local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  parse_func local_170 [1];
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  string local_140;
  ByteArray local_120;
  _Any_data local_108;
  code *local_f8;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  char local_d0 [16];
  writer local_c0;
  Message local_b8;
  
  local_1b8 = local_1a8;
  local_1c0 = 0;
  local_1b0 = 0;
  local_1a8[0] = 0;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  GetActiveOperationalDatasetTlvs(&local_120,aDatasetFlags);
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
              *)&local_108,aHandler);
  if ((this->mState & ~kPetitioning) == kConnected) {
    local_1e8 = (undefined1  [8])&local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"/c/ag","");
    coap::Message::SetUriPath((Error *)local_198,&local_b8,(string *)local_1e8);
    local_1c0 = local_198._0_4_;
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_190);
    tVar1 = local_1c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != &local_180) {
      operator_delete(local_190._M_p);
    }
    if (local_1e8 != (undefined1  [8])&local_1d8) {
      operator_delete((void *)local_1e8);
    }
    if (tVar1 != none_type) goto LAB_0015c67c;
    if (local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      tlv::Tlv::Tlv((Tlv *)local_1e8,kGet,&local_120,kMeshCoP);
      AppendTlv((Error *)local_198,&local_b8,(Tlv *)local_1e8);
      local_1c0 = local_198._0_4_;
      std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_190);
      tVar1 = local_1c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != &local_180) {
        operator_delete(local_190._M_p);
      }
      if (local_1e0 != (pointer)0x0) {
        operator_delete(local_1e0);
      }
      if (tVar1 != none_type) goto LAB_0015c67c;
    }
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      SignRequest((Error *)local_198,this,&local_b8,kMeshCoP,true);
      local_1c0 = local_198._0_4_;
      std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_190);
      tVar1 = local_1c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != &local_180) {
        operator_delete(local_190._M_p);
      }
      if (tVar1 != none_type) goto LAB_0015c67c;
    }
    local_158 = (code *)0x0;
    pcStack_150 = (code *)0x0;
    local_168._M_unused._M_object = (void *)0x0;
    local_168._8_8_ = 0;
    this_00 = (function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
               *)operator_new(0x20);
    std::
    function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
    ::function(this_00,(function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
                        *)&local_108);
    pcStack_150 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:481:23)>
                  ::_M_invoke;
    local_158 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:481:23)>
                ::_M_manager;
    local_168._M_unused._M_object = this_00;
    coap::CoapSecure::SendRequest(&this->mBrClient,&local_b8,(ResponseHandler *)&local_168);
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,__destroy_functor);
    }
    local_1e8 = (undefined1  [8])&local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"mgmt","");
    local_198 = (undefined1  [8])((ulong)(uint)local_198._4_4_ << 0x20);
    local_190._M_p = "sent MGMT_ACTIVE_GET.req";
    local_188 = 0x18;
    local_180._M_allocated_capacity = 0;
    local_170[0] = (parse_func)0x0;
    pcVar7 = "sent MGMT_ACTIVE_GET.req";
    local_180._8_8_ = (format_string_checker<char> *)local_198;
    do {
      pcVar4 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)local_198);
      }
      pcVar7 = pcVar4;
    } while (pcVar4 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_198;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_140,(v10 *)"sent MGMT_ACTIVE_GET.req",(string_view)ZEXT816(0x18),args);
    Log(kDebug,(string *)local_1e8,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    paVar5 = &local_1d8;
    local_140._M_dataplus._M_p = (pointer)local_1e8;
  }
  else {
    local_198 = (undefined1  [8])((ulong)local_198 & 0xffffffff00000000);
    pcVar7 = "the commissioner is not active or secure session is not connected";
    local_190._M_p = "the commissioner is not active or secure session is not connected";
    local_188 = 0x41;
    local_180._M_allocated_capacity = 0;
    local_170[0] = (parse_func)0x0;
    local_180._8_8_ = (format_string_checker<char> *)local_198;
    local_c0.handler_ = (format_string_checker<char> *)local_198;
    do {
      if (pcVar7 == "") break;
      pcVar4 = pcVar7;
      if (*pcVar7 == '{') {
LAB_0015c5bb:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_c0,pcVar7,pcVar4);
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",(format_string_checker<char> *)local_198);
        bVar8 = true;
      }
      else {
        pcVar4 = pcVar7 + 1;
        bVar8 = pcVar4 != "";
        if (bVar8) {
          if (*pcVar4 != '{') {
            pcVar2 = pcVar7 + 2;
            do {
              pcVar4 = pcVar2;
              bVar8 = pcVar4 != "";
              if (pcVar4 == "") goto LAB_0015c5b7;
              pcVar2 = pcVar4 + 1;
            } while (*pcVar4 != '{');
          }
          bVar8 = true;
        }
LAB_0015c5b7:
        if (bVar8) goto LAB_0015c5bb;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_c0,pcVar7,"");
        bVar8 = false;
      }
    } while (bVar8);
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_198;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_140,(v10 *)"the commissioner is not active or secure session is not connected"
               ,(string_view)ZEXT816(0x41),args_00);
    local_1e8._0_4_ = 0xf;
    local_1e0 = (pointer)(local_1d8._M_local_buf + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,local_140._M_dataplus._M_p,
               local_140._M_dataplus._M_p + local_140._M_string_length);
    local_1c0 = local_1e8._0_4_;
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_1e0);
    if (local_1e0 != (pointer)(local_1d8._M_local_buf + 8)) {
      operator_delete(local_1e0);
    }
    paVar5 = &local_140.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar5) {
    operator_delete(local_140._M_dataplus._M_p);
  }
LAB_0015c67c:
  if (local_1c0 != none_type) {
    local_e8._0_4_ = local_1c0;
    local_e0._M_p = local_d0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_1b8,local_1b8 + local_1b0);
    local_198 = (undefined1  [8])0x0;
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar6 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar6);
    }
    (*aHandler->_M_invoker)
              ((_Any_data *)aHandler,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> **)local_198,(Error *)local_e8
              );
    if (local_e0._M_p != local_d0) {
      operator_delete(local_e0._M_p);
    }
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  return;
}

Assistant:

void CommissionerImpl::GetRawActiveDataset(Handler<ByteArray> aHandler, uint16_t aDatasetFlags)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    ByteArray     datasetList = GetActiveOperationalDatasetTlvs(aDatasetFlags);

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        aHandler(&aResponse->GetPayload(), error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    VerifyOrExit(IsActiveOrConnected(),
                 error = ERROR_INVALID_STATE("the commissioner is not active or secure session is not connected"));
    SuccessOrExit(error = request.SetUriPath(uri::kMgmtActiveGet));
    if (!datasetList.empty())
    {
        SuccessOrExit(error = AppendTlv(request, {tlv::Type::kGet, datasetList}));
    }

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    // Send MGMT_ACTIVE_GET.req to the Border Agent but not the Leader,
    // because we don't possess the Mesh-Local Prefix before getting the
    // Active Operational Dataset.
    mBrClient.SendRequest(request, onResponse);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_ACTIVE_GET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}